

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void * crappyold(int sMem)

{
  return (void *)0x0;
}

Assistant:

void *crappyold(int sMem)
{
	/*
	static char *pMemPerm;
	static int iMemPerm;
	void *pMem;

	while (sMem % sizeof(long) != 0)
	{
		sMem++;
	}

	if (sMem > MAX_PERM_BLOCK)
	{
		RS.Logger.Error("Alloc_perm: {} too large.", sMem);
		exit(1);
	}

	if (pMemPerm == nullptr || iMemPerm + sMem > MAX_PERM_BLOCK)
	{
		iMemPerm = 0;

		if ((pMemPerm = calloc( 1, MAX_PERM_BLOCK ) ) == nullptr)
		{
			RS.Logger.Error("Crappyold: calloc: {}", std::strerror(errno));
			exit(1);
		}
	}

	pMem = pMemPerm + iMemPerm;
	iMemPerm += sMem;
	nAllocPerm += 1;
	sAllocPerm += sMem;
	return pMem;
	*/
	return nullptr;
}